

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::FieldDescriptorProto_Type>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::FieldDescriptorProto_Type>>>
::emplace_at<std::piecewise_construct_t_const&,std::tuple<char_const(&)[9]>,std::tuple<>>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::FieldDescriptorProto_Type>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::FieldDescriptorProto_Type>>>
           *this,iterator iter,piecewise_construct_t *args,tuple<const_char_(&)[9]> *args_1,
          tuple<> *args_2)

{
  size_t c;
  char (*__s) [9];
  bool bVar1;
  size_t sVar2;
  reference key;
  anon_union_8_1_a8a14541_for_iterator_2 aVar3;
  iterator local_58;
  iterator local_48;
  iterator local_38;
  
  aVar3 = iter.field_1;
  local_48.ctrl_ = iter.ctrl_;
  c = *(size_t *)this;
  *(undefined8 *)this = 0xffffffffffffff9c;
  __s = (args_1->super__Tuple_impl<0UL,_const_char_(&)[9]>).
        super__Head_base<0UL,_const_char_(&)[9],_false>._M_head_impl;
  local_48.field_1 = aVar3;
  sVar2 = strlen(*__s);
  *(size_t *)aVar3.slot_ = sVar2;
  *(char (**) [9])((long)aVar3.slot_ + 8) = __s;
  *(undefined4 *)((long)aVar3.slot_ + 0x10) = 0;
  CommonFields::set_capacity((CommonFields *)this,c);
  key = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>
        ::iterator::operator*(&local_48);
  local_38 = find<std::basic_string_view<char,std::char_traits<char>>>(this,&key->first);
  local_58.ctrl_ = local_48.ctrl_;
  local_58.field_1.slot_ = (slot_type *)local_48.field_1;
  bVar1 = container_internal::operator==(&local_38,&local_58);
  if (bVar1) {
    return;
  }
  __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xfe2,
                "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char>, google::protobuf::FieldDescriptorProto_Type>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string_view<char>, google::protobuf::FieldDescriptorProto_Type>>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string_view<char>, google::protobuf::FieldDescriptorProto_Type>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string_view<char>, google::protobuf::FieldDescriptorProto_Type>>, Args = <const std::piecewise_construct_t &, std::tuple<const char (&)[9]>, std::tuple<>>]"
               );
}

Assistant:

void emplace_at(iterator iter, Args&&... args) {
    construct(iter.slot(), std::forward<Args>(args)...);

    assert(PolicyTraits::apply(FindElement{*this}, *iter) == iter &&
           "constructed value does not match the lookup key");
  }